

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this,size_t count,float *value,
          polymorphic_allocator<float> *alloc)

{
  undefined8 *in_RCX;
  float *in_RDX;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RSI;
  polymorphic_allocator<float> *in_RDI;
  size_t i;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_28;
  
  in_RDI->memoryResource = (memory_resource *)*in_RCX;
  in_RDI[1].memoryResource = (memory_resource *)0x0;
  in_RDI[2].memoryResource = (memory_resource *)0x0;
  in_RDI[3].memoryResource = (memory_resource *)0x0;
  reserve(in_RSI,(size_t)in_RDX);
  for (local_28 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)0x0; local_28 < in_RSI;
      local_28 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                 ((long)&(local_28->alloc).memoryResource + 1)) {
    pmr::polymorphic_allocator<float>::construct<float,float_const&>
              (in_RDI,(float *)((long)&(in_RDI[1].memoryResource)->_vptr_memory_resource +
                               (long)local_28 * 4),in_RDX);
  }
  in_RDI[3].memoryResource = (memory_resource *)in_RSI;
  return;
}

Assistant:

vector(size_t count, const T &value, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(ptr + i, value);
        nStored = count;
    }